

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternModel.cpp
# Opt level: O0

void __thiscall PatternModel::setEffectParam(PatternModel *this,uint8_t nibble)

{
  EffectParamEditCmd *this_00;
  QUndoStack *pQVar1;
  bool local_69;
  QString local_60;
  EffectParamEditCmd *local_38;
  EffectParamEditCmd *cmd;
  uint8_t newParam;
  const_reference pvStack_28;
  bool isHighNibble;
  value_type *oldEffect;
  TrackRow *rowdata;
  int effectNo;
  uint8_t nibble_local;
  PatternModel *this_local;
  
  rowdata._7_1_ = nibble;
  _effectNo = this;
  rowdata._0_4_ = cursorEffectNo(this);
  oldEffect = (value_type *)cursorTrackRow(this);
  pvStack_28 = std::array<trackerboy::Effect,_3UL>::operator[]
                         (&((TrackRow *)oldEffect)->effects,(long)(int)rowdata);
  if (pvStack_28->type != noEffect) {
    local_69 = true;
    if (((this->mCursor).super_PatternCursorBase.column != 4) &&
       (local_69 = true, (this->mCursor).super_PatternCursorBase.column != 7)) {
      local_69 = (this->mCursor).super_PatternCursorBase.column == 10;
    }
    cmd._7_1_ = local_69;
    cmd._6_1_ = replaceNibble(pvStack_28->param,rowdata._7_1_,local_69);
    if (cmd._6_1_ != pvStack_28->param) {
      this_00 = (EffectParamEditCmd *)operator_new(0x20);
      EffectParamEditCmd::EffectEditCmd
                (this_00,this,(uint8_t)rowdata,cmd._6_1_,pvStack_28->param,(QUndoCommand *)0x0);
      local_38 = this_00;
      tr(&local_60,"edit effect parameter",(char *)0x0,-1);
      QUndoCommand::setText((QString *)this_00);
      QString::~QString(&local_60);
      pQVar1 = Module::undoStack(this->mModule);
      QUndoStack::push((QUndoCommand *)pQVar1);
    }
  }
  return;
}

Assistant:

void PatternModel::setEffectParam(uint8_t nibble) {
    auto effectNo = cursorEffectNo();
    auto &rowdata = cursorTrackRow();

    auto &oldEffect = rowdata.effects[effectNo];
    if (oldEffect.type != trackerboy::EffectType::noEffect) {
        bool isHighNibble = mCursor.column == PatternCursor::ColumnEffect1ArgHigh ||
                            mCursor.column == PatternCursor::ColumnEffect2ArgHigh ||
                            mCursor.column == PatternCursor::ColumnEffect3ArgHigh;
        auto newParam = replaceNibble(oldEffect.param, nibble, isHighNibble);
        if (newParam != oldEffect.param) {
            auto cmd = new EffectParamEditCmd(
                *this,
                (uint8_t)effectNo,
                newParam,
                oldEffect.param
            );
            cmd->setText(tr("edit effect parameter"));
            mModule.undoStack()->push(cmd);
        }
    }
        
}